

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  TestCaseInfo *testCase_local;
  Filter *this_local;
  
  __first = clara::std::
            vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
            ::begin(&this->m_patterns);
  __last = clara::std::
           vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ::end(&this->m_patterns);
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestSpec::Pattern>const*,std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>>>>,Catch::TestSpec::Filter::matches(Catch::TestCaseInfo_const&)const::__0>
                    ((__normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_std::shared_ptr<Catch::TestSpec::Pattern>_*,_std::vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>_>
                      )__last._M_current,(anon_class_8_1_a389c060)testCase);
  return bVar1;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        return std::all_of( m_patterns.begin(), m_patterns.end(), [&]( PatternPtr const& p ){ return p->matches( testCase ); } );
    }